

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O3

void processStackEntry(StackEntry *stackEntry,
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *originalGraph,
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *recoveredGraph,RegisterInfo *registerInfo,
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *tempToColorMap)

{
  int iVar1;
  mapped_type *pmVar2;
  
  addTempToRecoveredGraph(&stackEntry->temp,originalGraph,recoveredGraph);
  iVar1 = getColorForTemp(&stackEntry->temp,recoveredGraph,tempToColorMap);
  if (((ulong)((long)(registerInfo->registers).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(registerInfo->registers).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)iVar1) &&
     (iVar1 = IN_MEMORY_COLOR, stackEntry->isSpilled == false)) {
    __assert_fail("stackEntry.isSpilled",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/register_allocation/RegisterAllocation.cpp"
                  ,0x84,
                  "void processStackEntry(const StackEntry &, std::map<std::string, std::set<std::string>> &, std::map<std::string, std::set<std::string>> &, AssemblyCode::RegisterInfo &, std::map<std::string, int> &)"
                 );
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](tempToColorMap,&stackEntry->temp);
  *pmVar2 = iVar1;
  return;
}

Assistant:

void processStackEntry(
        const StackEntry& stackEntry,
        std::map<std::string, std::set<std::string>>& originalGraph,
        std::map<std::string, std::set<std::string>>& recoveredGraph,
        AssemblyCode::RegisterInfo& registerInfo,
        std::map<std::string, int>& tempToColorMap
) {
    addTempToRecoveredGraph(stackEntry.temp, originalGraph, recoveredGraph);
    int color = getColorForTemp(stackEntry.temp, recoveredGraph, tempToColorMap);
    if (color >= registerInfo.registers.size()) {
        assert(stackEntry.isSpilled);
        tempToColorMap[stackEntry.temp] = IN_MEMORY_COLOR;
    } else {
        tempToColorMap[stackEntry.temp] = color;
    }
}